

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

Float __thiscall
pbrt::ConductorBxDF::PDF
          (ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  float fVar1;
  float __x;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  Float FVar7;
  float fVar8;
  undefined8 in_XMM0_Qb;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 in_XMM2_Qb;
  Vector3f wm;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  fVar11 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_48 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_44 = wi.super_Tuple3<pbrt::Vector3,_float>.y;
  fStack_40 = (float)in_XMM2_Qb;
  fStack_3c = (float)((ulong)in_XMM2_Qb >> 0x20);
  local_38 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_34 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  fStack_30 = (float)in_XMM0_Qb;
  fStack_2c = (float)((ulong)in_XMM0_Qb >> 0x20);
  fVar8 = 0.0;
  if ((sampleFlags & Reflection) != Unset) {
    if (0.0 < fVar11 * wi.super_Tuple3<pbrt::Vector3,_float>.z) {
      auVar9 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                          ZEXT416((uint)(this->mfDistrib).alpha_x));
      fVar8 = 0.0;
      if (0.001 <= auVar9._0_4_) {
        if (PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
            ::reg == '\0') {
          iVar6 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                       ::reg,CONCAT44(in_register_00000034,mode));
          if (iVar6 != 0) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
        }
        local_48 = local_48 + local_38;
        fStack_44 = fStack_44 + fStack_34;
        fStack_40 = fStack_40 + fStack_30;
        fStack_3c = fStack_3c + fStack_2c;
        fVar1 = wi.super_Tuple3<pbrt::Vector3,_float>.z + fVar11;
        auVar9._0_4_ = local_48 * local_48;
        auVar9._4_4_ = fStack_44 * fStack_44;
        auVar9._8_4_ = fStack_40 * fStack_40;
        auVar9._12_4_ = fStack_3c * fStack_3c;
        auVar9 = vhaddps_avx(auVar9,auVar9);
        *(long *)(in_FS_OFFSET + -0x660) = *(long *)(in_FS_OFFSET + -0x660) + 1;
        __x = fVar1 * fVar1 + auVar9._0_4_;
        if ((__x == 0.0) && (!NAN(__x))) {
          *(long *)(in_FS_OFFSET + -0x668) = *(long *)(in_FS_OFFSET + -0x668) + 1;
        }
        if (PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
            ::reg == '\0') {
          iVar6 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                       ::reg);
          if (iVar6 != 0) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
        }
        *(long *)(in_FS_OFFSET + -0x650) = *(long *)(in_FS_OFFSET + -0x650) + 1;
        auVar4._8_4_ = fStack_30;
        auVar4._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar4._12_4_ = fStack_2c;
        auVar2._4_4_ = fStack_44;
        auVar2._0_4_ = local_48;
        auVar2._8_4_ = fStack_40;
        auVar2._12_4_ = fStack_3c;
        auVar10._0_4_ = local_48 * local_38;
        auVar10._4_4_ = fStack_44 * fStack_34;
        auVar10._8_4_ = fStack_40 * fStack_30;
        auVar10._12_4_ = fStack_3c * fStack_2c;
        auVar9 = vmovshdup_avx(auVar10);
        auVar9 = vfmadd231ss_fma(auVar9,auVar4,auVar2);
        auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar1),ZEXT416((uint)fVar11));
        fVar8 = 0.0;
        if (auVar9._0_4_ < 0.0) {
          *(long *)(in_FS_OFFSET + -0x658) = *(long *)(in_FS_OFFSET + -0x658) + 1;
        }
        if (((__x != 0.0) || (NAN(__x))) && (0.0 < auVar9._0_4_)) {
          if (__x < 0.0) {
            fVar8 = sqrtf(__x);
          }
          else {
            auVar9 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
            fVar8 = auVar9._0_4_;
          }
          auVar12._4_4_ = fVar8;
          auVar12._0_4_ = fVar8;
          auVar12._8_4_ = fVar8;
          auVar12._12_4_ = fVar8;
          auVar3._4_4_ = fStack_44;
          auVar3._0_4_ = local_48;
          auVar3._8_4_ = fStack_40;
          auVar3._12_4_ = fStack_3c;
          auVar9 = vdivps_avx(auVar3,auVar12);
          wm.super_Tuple3<pbrt::Vector3,_float>.z = fVar1 / fVar8;
          wm.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar9._0_8_;
          FVar7 = TrowbridgeReitzDistribution::PDF(&this->mfDistrib,wo,wm);
          auVar5._8_4_ = fStack_30;
          auVar5._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar5._12_4_ = fStack_2c;
          auVar13._0_4_ = auVar9._0_4_ * local_38;
          auVar13._4_4_ = auVar9._4_4_ * fStack_34;
          auVar13._8_4_ = auVar9._8_4_ * fStack_30;
          auVar13._12_4_ = auVar9._12_4_ * fStack_2c;
          auVar2 = vmovshdup_avx(auVar13);
          auVar9 = vfmadd231ss_fma(auVar2,auVar9,auVar5);
          auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)wm.super_Tuple3<pbrt::Vector3,_float>.z),
                                   ZEXT416((uint)fVar11));
          fVar8 = FVar7 / (auVar9._0_4_ * 4.0);
        }
      }
    }
  }
  return fVar8;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags) const {
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return 0;
        if (!SameHemisphere(wo, wi))
            return 0;
        if (mfDistrib.EffectivelySmooth())
            return 0;
        // Return PDF for sampling Torrance--Sparrow conductor BRDF
        Vector3f wh = wo + wi;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        CHECK_RARE(1e-5f, Dot(wo, wh) < 0);
        if (LengthSquared(wh) == 0 || Dot(wo, wh) <= 0)
            return 0;
        wh = Normalize(wh);
        return mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh));
    }